

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_client_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  int iVar3;
  uchar *in_RAX;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  mbedtls_mpi *X;
  uchar *puVar7;
  uchar *p;
  uchar *local_28;
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  local_28 = in_RAX;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xcd4,"=> parse client key exchange");
  iVar3 = mbedtls_ssl_read_record(ssl);
  if (iVar3 != 0) {
    pcVar6 = "mbedtls_ssl_read_record";
    iVar5 = 0xcd8;
    goto LAB_00117632;
  }
  puVar7 = ssl->in_msg;
  uVar4 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2);
  local_28 = puVar7 + uVar4 * 4 + 4;
  if (ssl->in_msgtype != 0x16) {
    pcVar6 = "bad client key exchange message";
    iVar3 = 0xce1;
LAB_00117719:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar3,pcVar6);
    return -0x7c00;
  }
  if (*puVar7 != '\x10') {
    pcVar6 = "bad client key exchange message";
    iVar3 = 0xce7;
    goto LAB_00117719;
  }
  if (9 < pmVar1->key_exchange - MBEDTLS_KEY_EXCHANGE_RSA) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdb5,"should never happen");
    return -0x6c00;
  }
  puVar7 = puVar7 + ssl->in_hslen;
  switch(pmVar1->key_exchange) {
  case MBEDTLS_KEY_EXCHANGE_RSA:
    iVar3 = ssl_parse_encrypted_pms(ssl,local_28,puVar7,0);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_parse_encrypted_pms_secret";
      iVar5 = 0xd98;
      goto LAB_00117632;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
    iVar3 = ssl_parse_client_dh_public(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_dh_public";
      iVar5 = 0xcf0;
      goto LAB_00117632;
    }
    if (local_28 != puVar7) {
      pcVar6 = "bad client key exchange";
      iVar3 = 0xcf6;
      goto LAB_00117719;
    }
    pmVar2 = ssl->handshake;
    iVar3 = mbedtls_dhm_calc_secret
                      (&pmVar2->dhm_ctx,pmVar2->premaster,0x424,&pmVar2->pmslen,
                       (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_dhm_calc_secret";
      iVar5 = 0xd00;
      goto LAB_001177ad;
    }
    X = &(ssl->handshake->dhm_ctx).K;
    pcVar6 = "DHM: K ";
    iVar3 = 0xd04;
    goto LAB_0011795f;
  default:
    iVar3 = mbedtls_ecdh_read_public
                      (&ssl->handshake->ecdh_ctx,local_28,ssl->in_hslen - (uVar4 * 4 + 4));
    if (iVar3 != 0) {
      iVar5 = 0xd14;
LAB_001176d2:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar5,"mbedtls_ecdh_read_public",iVar3);
      return -0x7c80;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xd18,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    pmVar2 = ssl->handshake;
    iVar3 = mbedtls_ecdh_calc_secret
                      (&pmVar2->ecdh_ctx,&pmVar2->pmslen,pmVar2->premaster,0x400,
                       (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_ecdh_calc_secret";
      iVar5 = 0xd20;
LAB_001177ad:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar5,pcVar6,iVar3);
      return -32000;
    }
    X = &(ssl->handshake->ecdh_ctx).z;
    pcVar6 = "ECDH: z  ";
    iVar3 = 0xd24;
LAB_0011795f:
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar3,pcVar6,X);
    break;
  case MBEDTLS_KEY_EXCHANGE_PSK:
    iVar3 = ssl_parse_client_psk_identity(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_psk_identity";
      iVar5 = 0xd30;
      goto LAB_00117632;
    }
    if (local_28 != puVar7) {
      pcVar6 = "bad client key exchange";
      iVar3 = 0xd36;
      goto LAB_00117719;
    }
    iVar3 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar1->key_exchange);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_ssl_psk_derive_premaster";
      iVar5 = 0xd3d;
      goto LAB_00117632;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    iVar3 = ssl_parse_client_psk_identity(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_psk_identity";
      iVar5 = 0xd60;
      goto LAB_00117632;
    }
    iVar3 = ssl_parse_client_dh_public(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_dh_public";
      iVar5 = 0xd65;
      goto LAB_00117632;
    }
    if (local_28 != puVar7) {
      pcVar6 = "bad client key exchange";
      iVar3 = 0xd6b;
      goto LAB_00117719;
    }
    iVar3 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar1->key_exchange);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_ssl_psk_derive_premaster";
      iVar5 = 0xd72;
      goto LAB_00117632;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    iVar3 = ssl_parse_client_psk_identity(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_psk_identity";
      iVar5 = 0xd48;
      goto LAB_00117632;
    }
    iVar3 = ssl_parse_encrypted_pms(ssl,local_28,puVar7,2);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_encrypted_pms";
      iVar5 = 0xd4e;
      goto LAB_00117632;
    }
    iVar3 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar1->key_exchange);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_ssl_psk_derive_premaster";
      iVar5 = 0xd55;
      goto LAB_00117632;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    iVar3 = ssl_parse_client_psk_identity(ssl,&local_28,puVar7);
    if (iVar3 != 0) {
      pcVar6 = "ssl_parse_client_psk_identity";
      iVar5 = 0xd7d;
      goto LAB_00117632;
    }
    iVar3 = mbedtls_ecdh_read_public
                      (&ssl->handshake->ecdh_ctx,local_28,(long)puVar7 - (long)local_28);
    if (iVar3 != 0) {
      iVar5 = 0xd84;
      goto LAB_001176d2;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xd88,"ECDH: Qp ",&(ssl->handshake->ecdh_ctx).Qp);
    iVar3 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar1->key_exchange);
    if (iVar3 != 0) {
      pcVar6 = "mbedtls_ssl_psk_derive_premaster";
      iVar5 = 0xd8d;
      goto LAB_00117632;
    }
  }
  iVar3 = mbedtls_ssl_derive_keys(ssl);
  if (iVar3 == 0) {
    ssl->state = ssl->state + 1;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdc1,"<= parse client key exchange");
    return 0;
  }
  pcVar6 = "mbedtls_ssl_derive_keys";
  iVar5 = 0xdbb;
LAB_00117632:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,iVar5,pcVar6,iVar3);
  return iVar3;
}

Assistant:

static int ssl_parse_client_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info;
    unsigned char *p, *end;

    ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse client key exchange" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    p = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_KEY_EXCHANGE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA )
    {
        if( ( ret = ssl_parse_client_dh_public( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_dh_public" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      ssl->handshake->premaster,
                                      MBEDTLS_PREMASTER_SIZE,
                                     &ssl->handshake->pmslen,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) ||                      \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = mbedtls_ecdh_read_public( &ssl->handshake->ecdh_ctx,
                                      p, end - p) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_read_public", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Qp ", &ssl->handshake->ecdh_ctx.Qp );

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx,
                                      &ssl->handshake->pmslen,
                                       ssl->handshake->premaster,
                                       MBEDTLS_MPI_MAX_SIZE,
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z  ", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( ( ret = ssl_parse_encrypted_pms( ssl, p, end, 2 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_encrypted_pms" ), ret );
            return( ret );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }
        if( ( ret = ssl_parse_client_dh_public( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_dh_public" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( ( ret = mbedtls_ecdh_read_public( &ssl->handshake->ecdh_ctx,
                                       p, end - p ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_read_public", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Qp ", &ssl->handshake->ecdh_ctx.Qp );

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        if( ( ret = ssl_parse_encrypted_pms( ssl, p, end, 0 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_parse_encrypted_pms_secret" ), ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        ret = mbedtls_ecjpake_read_round_two( &ssl->handshake->ecjpake_ctx,
                                              p, end - p );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_read_round_two", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }

        ret = mbedtls_ecjpake_derive_secret( &ssl->handshake->ecjpake_ctx,
                ssl->handshake->premaster, 32, &ssl->handshake->pmslen,
                ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_derive_secret", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
        return( ret );
    }

    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse client key exchange" ) );

    return( 0 );
}